

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O2

unique_ptr<CAssemblerCommand,_std::default_delete<CAssemblerCommand>_> __thiscall
Parser::parse(Parser *this,Tokenizer *tokenizer,bool virtualFile,path *name)

{
  _List_node_base **pp_Var1;
  bool bVar2;
  size_t sVar3;
  undefined7 in_register_00000011;
  path *in_R8;
  FileEntry entry;
  
  entry.tokenizer = (Tokenizer *)CONCAT71(in_register_00000011,virtualFile);
  if ((ulong)(((long)(tokenizer->tokens).super__List_base<Token,_std::allocator<Token>_>._M_impl.
                     _M_node.super__List_node_base._M_prev -
              (long)(tokenizer->tokens).super__List_base<Token,_std::allocator<Token>_>._M_impl.
                    _M_node.super__List_node_base._M_next) / 0x18) < 0x96) {
    entry.virtualFile = SUB81(name,0);
    if ((entry.virtualFile != false) || (bVar2 = ghc::filesystem::path::empty(in_R8), bVar2)) {
      entry.fileNum = -1;
    }
    else {
      sVar3 = FileList::size(&Global.fileList);
      entry.fileNum = (int)sVar3;
      FileList::add(&Global.fileList,in_R8);
    }
    std::vector<Parser::FileEntry,_std::allocator<Parser::FileEntry>_>::push_back
              ((vector<Parser::FileEntry,_std::allocator<Parser::FileEntry>_> *)tokenizer,&entry);
    parseCommandSequence(this,(char)tokenizer,(initializer_list<const_char_*>)ZEXT816(0));
    pp_Var1 = &(tokenizer->tokens).super__List_base<Token,_std::allocator<Token>_>._M_impl._M_node.
               super__List_node_base._M_prev;
    *pp_Var1 = (_List_node_base *)&(*pp_Var1)[-2]._M_prev;
    return (__uniq_ptr_data<CAssemblerCommand,_std::default_delete<CAssemblerCommand>,_true,_true>)
           (__uniq_ptr_data<CAssemblerCommand,_std::default_delete<CAssemblerCommand>,_true,_true>)
           this;
  }
  Logger::queueError<>(Error,"Max include/recursion depth reached");
  (this->entries).super__Vector_base<Parser::FileEntry,_std::allocator<Parser::FileEntry>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  return (__uniq_ptr_data<CAssemblerCommand,_std::default_delete<CAssemblerCommand>,_true,_true>)
         (__uniq_ptr_data<CAssemblerCommand,_std::default_delete<CAssemblerCommand>,_true,_true>)
         this;
}

Assistant:

std::unique_ptr<CAssemblerCommand> Parser::parse(Tokenizer* tokenizer, bool virtualFile, const fs::path& name)
{
	if (entries.size() >= 150)
	{
		Logger::queueError(Logger::Error, "Max include/recursion depth reached");
		return nullptr;
	}

	FileEntry entry;
	entry.tokenizer = tokenizer;
	entry.virtualFile = virtualFile;

	if (!virtualFile && !name.empty())
	{
		entry.fileNum = (int) Global.fileList.size();
		Global.fileList.add(name);
	} else {
		entry.fileNum = -1;
	}

	entries.push_back(entry);

	std::unique_ptr<CAssemblerCommand> sequence = parseCommandSequence();
	entries.pop_back();

	return sequence;
}